

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void __thiscall
vkt::anon_unknown_0::ShaderCase::initPrograms(ShaderCase *this,SourceCollections *sourceCollection)

{
  ulong uVar1;
  undefined8 uVar2;
  pointer this_00;
  bool bVar3;
  size_type sVar4;
  InternalError *this_01;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  ProgramSources *pPVar8;
  ShaderCaseSpecification *spec;
  ShaderCaseSpecification *spec_00;
  string local_1d8;
  ProgramSources *local_1b8;
  ProgramSources *curSrc;
  ulong uStack_1a8;
  int shaderType;
  size_t progNdx_1;
  ProgramSpecializationParams progSpecParams;
  size_t progNdx;
  undefined1 local_168 [4];
  int maxPatchVertices;
  ShaderSource local_148;
  string local_120;
  ShaderSource local_100;
  string local_d8;
  ShaderSource local_b8;
  string local_90;
  ShaderSource local_70;
  allocator<glu::ProgramSources> local_31;
  undefined1 local_30 [8];
  vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> specializedSources;
  SourceCollections *sourceCollection_local;
  ShaderCase *this_local;
  
  specializedSources.super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sourceCollection;
  sVar4 = std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::size(&(this->m_spec).programs);
  std::allocator<glu::ProgramSources>::allocator(&local_31);
  std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::vector
            ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)local_30,sVar4,
             &local_31);
  std::allocator<glu::ProgramSources>::~allocator(&local_31);
  if ((this->m_spec).expectResult == EXPECT_PASS) {
    if ((this->m_spec).caseType == CASETYPE_VERTEX_ONLY) {
      pvVar5 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::operator[]
                         ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                          local_30,0);
      pvVar6 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[](&(this->m_spec).programs,0);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pvVar6,0);
      specializeVertexShader(&local_90,&this->m_spec,pvVar7);
      glu::VertexSource::VertexSource((VertexSource *)&local_70,&local_90);
      pPVar8 = glu::ProgramSources::operator<<(pvVar5,&local_70);
      vkt::(anonymous_namespace)::genFragmentShader_abi_cxx11_
                (&local_d8,(_anonymous_namespace_ *)&this->m_spec,spec);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_b8,&local_d8);
      glu::ProgramSources::operator<<(pPVar8,&local_b8);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      glu::VertexSource::~VertexSource((VertexSource *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else if ((this->m_spec).caseType == CASETYPE_FRAGMENT_ONLY) {
      pvVar5 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::operator[]
                         ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                          local_30,0);
      vkt::(anonymous_namespace)::genVertexShader_abi_cxx11_
                (&local_120,(_anonymous_namespace_ *)&this->m_spec,spec_00);
      glu::VertexSource::VertexSource((VertexSource *)&local_100,&local_120);
      pPVar8 = glu::ProgramSources::operator<<(pvVar5,&local_100);
      pvVar6 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[](&(this->m_spec).programs,0);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((pvVar6->sources).sources + 1,0);
      specializeFragmentShader((string *)local_168,&this->m_spec,pvVar7);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_148,(string *)local_168);
      glu::ProgramSources::operator<<(pPVar8,&local_148);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_148);
      std::__cxx11::string::~string((string *)local_168);
      glu::VertexSource::~VertexSource((VertexSource *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      progSpecParams.maxPatchVertices = 0;
      progSpecParams._36_4_ = 0;
      for (; uVar2 = progSpecParams._32_8_,
          sVar4 = std::
                  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ::size(&(this->m_spec).programs), (ulong)uVar2 < sVar4;
          progSpecParams._32_8_ = progSpecParams._32_8_ + 1) {
        pvVar6 = std::
                 vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ::operator[](&(this->m_spec).programs,progSpecParams._32_8_);
        glu::sl::ProgramSpecializationParams::ProgramSpecializationParams
                  ((ProgramSpecializationParams *)&progNdx_1,&this->m_spec,
                   &pvVar6->requiredExtensions,4);
        pvVar5 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::operator[]
                           ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                            local_30,progSpecParams._32_8_);
        pvVar6 = std::
                 vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ::operator[](&(this->m_spec).programs,progSpecParams._32_8_);
        specializeProgramSources(pvVar5,&pvVar6->sources,(ProgramSpecializationParams *)&progNdx_1);
        glu::sl::ProgramSpecializationParams::~ProgramSpecializationParams
                  ((ProgramSpecializationParams *)&progNdx_1);
      }
    }
    for (uStack_1a8 = 0; uVar1 = uStack_1a8,
        sVar4 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::size
                          ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                           local_30), uVar1 < sVar4; uStack_1a8 = uStack_1a8 + 1) {
      for (curSrc._4_4_ = 0; (int)curSrc._4_4_ < 6; curSrc._4_4_ = curSrc._4_4_ + 1) {
        pvVar5 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::operator[]
                           ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                            local_30,uStack_1a8);
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar5->sources + (int)curSrc._4_4_);
        this_00 = specializedSources.
                  super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (!bVar3) {
          vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
                    (&local_1d8,(_anonymous_namespace_ *)(ulong)curSrc._4_4_,(ShaderType)uStack_1a8,
                     sVar4);
          pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                             ((ProgramCollection<glu::ProgramSources> *)this_00,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          local_1b8 = pPVar8;
          pvVar5 = std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::
                   operator[]((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)
                              local_30,uStack_1a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(local_1b8->sources + (int)curSrc._4_4_,pvVar5->sources + (int)curSrc._4_4_);
        }
      }
    }
    std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::~vector
              ((vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> *)local_30);
    return;
  }
  this_01 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_01,"Only EXPECT_PASS is supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktShaderLibrary.cpp"
             ,0x6be);
  __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void ShaderCase::initPrograms (SourceCollections& sourceCollection) const
{
	vector<ProgramSources>	specializedSources	(m_spec.programs.size());

	DE_ASSERT(isValid(m_spec));

	if (m_spec.expectResult != glu::sl::EXPECT_PASS)
		TCU_THROW(InternalError, "Only EXPECT_PASS is supported");

	if (m_spec.caseType == glu::sl::CASETYPE_VERTEX_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX].size() == 1);
		specializedSources[0] << glu::VertexSource(specializeVertexShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX][0]))
							  << glu::FragmentSource(genFragmentShader(m_spec));
	}
	else if (m_spec.caseType == glu::sl::CASETYPE_FRAGMENT_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT].size() == 1);
		specializedSources[0] << glu::VertexSource(genVertexShader(m_spec))
							  << glu::FragmentSource(specializeFragmentShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT][0]));
	}
	else
	{
		DE_ASSERT(m_spec.caseType == glu::sl::CASETYPE_COMPLETE);

		const int	maxPatchVertices	= 4; // \todo [2015-08-05 pyry] Query

		for (size_t progNdx = 0; progNdx < m_spec.programs.size(); progNdx++)
		{
			const ProgramSpecializationParams	progSpecParams	(m_spec, m_spec.programs[progNdx].requiredExtensions, maxPatchVertices);

			specializeProgramSources(specializedSources[progNdx], m_spec.programs[progNdx].sources, progSpecParams);
		}
	}

	for (size_t progNdx = 0; progNdx < specializedSources.size(); progNdx++)
	{
		for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
		{
			if (!specializedSources[progNdx].sources[shaderType].empty())
			{
				glu::ProgramSources& curSrc	= sourceCollection.glslSources.add(getShaderName((glu::ShaderType)shaderType, progNdx));
				curSrc.sources[shaderType] = specializedSources[progNdx].sources[shaderType];
			}
		}
	}
}